

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

void OutputDebugString(wchar_t *pOut)

{
  int __fd;
  wstring strTmp;
  wchar_t *local_b0;
  size_t local_a8;
  long local_a0 [2];
  byte_string local_90;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  local_70;
  
  __fd = open("/tmp/dbgout",0x801);
  if (-1 < __fd) {
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_b0,pOut,(allocator<wchar_t> *)&local_70);
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
    ::wstring_convert(&local_70);
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
    ::to_bytes(&local_90,&local_70,local_b0,local_b0 + local_a8);
    write(__fd,local_90._M_dataplus._M_p,local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
    ::~wstring_convert(&local_70);
    close(__fd);
    if (local_b0 != (wchar_t *)local_a0) {
      operator_delete(local_b0,local_a0[0] * 4 + 4);
    }
  }
  return;
}

Assistant:

void OutputDebugString(const wchar_t* pOut)
{   // mkfifo /tmp/dbgout  ->  tail -f /tmp/dbgout
    int fdPipe = open("/tmp/dbgout", O_WRONLY | O_NONBLOCK);
    if (fdPipe >= 0)
    {
        wstring strTmp(pOut);
        write(fdPipe, wstring_convert<std::codecvt_utf8<wchar_t>, wchar_t>().to_bytes(strTmp).c_str(), strTmp.size());
        close(fdPipe);
    }
}